

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

optional<unsigned_int>
anon_unknown.dwarf_1f0a16::ParseKeyPathNum(Span<const_char> elem,bool *apostrophe,string *error)

{
  char cVar1;
  string_view str;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  undefined8 in_RDX;
  size_t in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  Span<const_char> SVar5;
  char last;
  bool hardened;
  uint32_t p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  uint *in_stack_fffffffffffffeb0;
  Span<const_char> *in_stack_fffffffffffffeb8;
  allocator<char> *in_stack_fffffffffffffec0;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  uint *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  undefined1 local_b6;
  undefined1 local_b5 [13];
  size_t local_a8;
  allocator<char> local_a0 [8];
  size_t local_98;
  _Optional_payload_base<unsigned_int> local_90 [17];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0 = (allocator<char>  [8])in_RDI;
  local_98 = in_RSI;
  sVar3 = Span<const_char>::size((Span<const_char> *)in_stack_fffffffffffffea8);
  if (sVar3 != 0) {
    Span<const_char>::size((Span<const_char> *)in_stack_fffffffffffffea8);
    pcVar4 = Span<const_char>::operator[]
                       (in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
    cVar1 = *pcVar4;
    if ((cVar1 == '\'') || (cVar1 == 'h')) {
      Span<const_char>::size((Span<const_char> *)in_stack_fffffffffffffea8);
      SVar5 = Span<const_char>::first(in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
      local_b5._5_8_ = SVar5.m_data;
      local_a0[0] = (allocator<char>)local_b5[5];
      local_a0[1] = (allocator<char>)local_b5[6];
      local_a0[2] = (allocator<char>)local_b5[7];
      local_a0[3] = (allocator<char>)local_b5[8];
      local_a0[4] = (allocator<char>)local_b5[9];
      local_a0[5] = (allocator<char>)local_b5[10];
      local_a0[6] = (allocator<char>)local_b5[0xb];
      local_a0[7] = (allocator<char>)local_b5[0xc];
      local_a8 = SVar5.m_size;
      local_98 = local_a8;
      *(bool *)in_RDX = cVar1 == '\'';
      unique0x100003fb = SVar5;
    }
  }
  Span<const_char>::begin((Span<const_char> *)in_stack_fffffffffffffea8);
  Span<const_char>::end((Span<const_char> *)in_stack_fffffffffffffea8);
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>
            (in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
             (char *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffec8);
  str._M_str = (char *)in_stack_fffffffffffffec8;
  str._M_len = (size_t)in_stack_fffffffffffffec0;
  bVar2 = ParseUInt32(str,(uint32_t *)in_stack_fffffffffffffea8);
  std::__cxx11::string::~string(in_stack_fffffffffffffea8);
  std::allocator<char>::~allocator((allocator<char> *)local_b5);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    if ((uint)local_b5._1_4_ < 0x80000000) {
      local_90[0] = (_Optional_payload_base<unsigned_int>)
                    std::make_optional<unsigned_int>(in_stack_fffffffffffffeb0);
    }
    else {
      tinyformat::format<unsigned_int>((char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffff08,__str);
      std::__cxx11::string::~string(in_stack_fffffffffffffea8);
      std::optional<unsigned_int>::optional((optional<unsigned_int> *)local_90);
    }
  }
  else {
    __a = local_a0;
    pcVar4 = Span<const_char>::begin((Span<const_char> *)in_stack_fffffffffffffea8);
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Span<const_char>::end((Span<const_char> *)in_stack_fffffffffffffea8);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>(this,(char *)args,pcVar4,__a);
    tinyformat::format<std::__cxx11::string>((char *)this,args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff08,__str);
    std::__cxx11::string::~string(in_stack_fffffffffffffea8);
    std::__cxx11::string::~string(in_stack_fffffffffffffea8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b6);
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)local_90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (optional<unsigned_int>)local_90[0];
}

Assistant:

std::optional<uint32_t> ParseKeyPathNum(Span<const char> elem, bool& apostrophe, std::string& error)
{
    bool hardened = false;
    if (elem.size() > 0) {
        const char last = elem[elem.size() - 1];
        if (last == '\'' || last == 'h') {
            elem = elem.first(elem.size() - 1);
            hardened = true;
            apostrophe = last == '\'';
        }
    }
    uint32_t p;
    if (!ParseUInt32(std::string(elem.begin(), elem.end()), &p)) {
        error = strprintf("Key path value '%s' is not a valid uint32", std::string(elem.begin(), elem.end()));
        return std::nullopt;
    } else if (p > 0x7FFFFFFFUL) {
        error = strprintf("Key path value %u is out of range", p);
        return std::nullopt;
    }

    return std::make_optional<uint32_t>(p | (((uint32_t)hardened) << 31));
}